

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::scoped_padder>::format
          (mdc_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  undefined1 local_58 [8];
  scoped_padder p;
  mdc_map_t *mdc_map;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *param_1_local;
  mdc_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = (size_t)mdc::get_context_abi_cxx11_();
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)p.spaces_.size_);
  if (bVar1) {
    scoped_padder::scoped_padder
              ((scoped_padder *)local_58,0,&(this->super_flag_formatter).padinfo_,dest);
    scoped_padder::~scoped_padder((scoped_padder *)local_58);
  }
  else {
    format_mdc(this,(mdc_map_t *)p.spaces_.size_,dest);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override {
        auto &mdc_map = mdc::get_context();
        if (mdc_map.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        } else {
            format_mdc(mdc_map, dest);
        }
    }